

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,SeqStatement *seq_statement)

{
  ostream *this_00;
  SeqStatement *seq_statement_local;
  PrintVisitor *this_local;
  
  PrintTabs(this);
  this_00 = std::operator<<((ostream *)&this->stream_,"SeqStatement:");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(seq_statement->first_statement_->super_BaseElement)._vptr_BaseElement[2])();
  (*(seq_statement->second_statement_->super_BaseElement)._vptr_BaseElement[2])
            (seq_statement->second_statement_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(SeqStatement* seq_statement) {
  PrintTabs();
  stream_ << "SeqStatement:" << std::endl;

  ++num_tabs_;
  seq_statement->first_statement_->Accept(this);
  seq_statement->second_statement_->Accept(this);
  --num_tabs_;
}